

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O3

void * __thiscall asmjit::VMemMgr::alloc(VMemMgr *this,size_t size,uint32_t type)

{
  PermanentNode **ppPVar1;
  uint8_t *puVar2;
  bool bVar3;
  size_t __size;
  MemNode *pMVar4;
  int iVar5;
  ulong len;
  ulong uVar6;
  ulong uVar7;
  MemNode *__ptr;
  MemNode *pMVar8;
  PermanentNode *__s;
  MemNode *pMVar9;
  uint uVar10;
  ulong uVar11;
  MemNode **ppMVar12;
  ulong uVar13;
  ulong uVar14;
  RbNode **ppRVar15;
  ulong uVar16;
  ulong uVar17;
  uint8_t *puVar18;
  long lVar19;
  ulong uVar20;
  MemNode *pMVar21;
  uint uVar22;
  RbNode *pRVar23;
  size_t *buf;
  ulong uVar24;
  MemNode *pMVar25;
  ulong uVar26;
  RbNode *pRVar27;
  ulong *puVar28;
  MemNode *pMVar29;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  bool bVar33;
  RbNode *local_58;
  MemNode *pMStack_50;
  uint8_t *puStack_48;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  
  uVar32 = size + 0x1f & 0xffffffffffffffe0;
  if (type == 1) {
    pthread_mutex_lock((pthread_mutex_t *)this);
    ppPVar1 = &this->_permanent;
    __s = (PermanentNode *)ppPVar1;
    do {
      __s = __s->prev;
      if (__s == (PermanentNode *)0x0) {
        __s = (PermanentNode *)malloc(0x20);
        if (__s == (PermanentNode *)0x0) goto LAB_001732b6;
        sVar31 = 0x8000;
        if (0x8000 < uVar32) {
          sVar31 = uVar32;
        }
        puVar18 = (uint8_t *)OSUtils::allocVirtualMemory(sVar31,&__s->size,3);
        __s->mem = puVar18;
        if (puVar18 == (uint8_t *)0x0) goto LAB_001732b1;
        __s->used = 0;
        __s->prev = *ppPVar1;
        sVar31 = 0;
        *ppPVar1 = __s;
        goto LAB_00173259;
      }
      sVar31 = __s->used;
    } while (__s->size - sVar31 < uVar32);
    puVar18 = __s->mem;
LAB_00173259:
    puVar18 = puVar18 + sVar31;
    __s->used = sVar31 + uVar32;
    this->_usedBytes = this->_usedBytes + uVar32;
  }
  else {
    if (uVar32 == 0) {
      return (void *)0x0;
    }
    pthread_mutex_lock((pthread_mutex_t *)this);
    uVar7 = this->_blockSize;
    pMVar9 = this->_optimal;
    ppMVar12 = &this->_optimal;
    if (pMVar9 != (MemNode *)0x0) {
      __ptr = pMVar9;
      do {
        uVar11 = __ptr->size - __ptr->used;
        if ((uVar11 < uVar32) || (__ptr->largestBlock != 0 && __ptr->largestBlock < uVar32)) {
          pMVar8 = __ptr->next;
          if ((uVar11 < uVar7) && (pMVar8 != (MemNode *)0x0 && __ptr == pMVar9)) {
            *ppMVar12 = pMVar8;
            pMVar9 = pMVar8;
          }
        }
        else {
          uVar11 = __ptr->density;
          uVar17 = __ptr->blocks;
          len = ((uVar32 - 1) + uVar11) / uVar11;
          uVar13 = 0;
          if (uVar17 != 0) {
            buf = __ptr->baUsed;
            uVar13 = 0;
            uVar16 = 0;
            uVar20 = 0;
            puVar28 = buf;
            do {
              if (*puVar28 == 0xffffffffffffffff) {
                if (uVar13 < uVar16) {
                  uVar13 = uVar16;
                }
                uVar16 = 0;
              }
              else {
                uVar26 = uVar17 - uVar20;
                if (uVar20 + 0x40 <= uVar17) {
                  uVar26 = 0x40;
                }
                if (uVar26 != 0) {
                  uVar14 = 1;
                  uVar6 = 0;
                  uVar24 = uVar16;
                  do {
                    if ((uVar14 & *puVar28) == 0) {
                      uVar16 = uVar24 + 1;
                      if (uVar16 == len) {
                        sVar31 = (uVar20 - uVar24) + uVar6;
                        goto LAB_00173332;
                      }
                    }
                    else {
                      if (uVar13 < uVar24) {
                        uVar13 = uVar24;
                      }
                      uVar16 = 0;
                    }
                    uVar6 = uVar6 + 1;
                    uVar14 = uVar14 * 2;
                    uVar24 = uVar16;
                  } while (uVar6 < uVar26);
                }
              }
              uVar20 = uVar20 + 0x40;
              puVar28 = puVar28 + 1;
            } while (uVar20 < uVar17);
          }
          __ptr->largestBlock = uVar13 * uVar11;
          pMVar8 = __ptr->next;
        }
        __ptr = pMVar8;
      } while (pMVar8 != (MemNode *)0x0);
    }
    uVar11 = this->_blockDensity;
    if (uVar7 <= uVar32) {
      uVar7 = uVar32;
    }
    puVar18 = (uint8_t *)OSUtils::allocVirtualMemory(uVar7,(size_t *)&stack0xffffffffffffffa8,3);
    pRVar23 = local_58;
    if (puVar18 != (uint8_t *)0x0) {
      uVar7 = (ulong)local_58 / uVar11;
      uVar17 = (uVar7 + 7 >> 3) + 7 & 0xfffffffffffffff8;
      __ptr = (MemNode *)malloc(0x68);
      __size = uVar17 * 2;
      __s = (PermanentNode *)malloc(__size);
      if ((__ptr != (MemNode *)0x0) && (__s != (PermanentNode *)0x0)) {
        (__ptr->super_RbNode).node[0] = (RbNode *)0x0;
        (__ptr->super_RbNode).node[1] = (RbNode *)0x0;
        (__ptr->super_RbNode).mem = puVar18;
        (__ptr->super_RbNode).red = 1;
        __ptr->prev = (MemNode *)0x0;
        __ptr->next = (MemNode *)0x0;
        __ptr->size = (size_t)pRVar23;
        __ptr->used = 0;
        __ptr->blocks = uVar7;
        __ptr->density = uVar11;
        __ptr->largestBlock = (size_t)pRVar23;
        memset(__s,0,__size);
        __ptr->baUsed = (size_t *)__s;
        __ptr->baCont = (size_t *)((long)&__s->prev + uVar17);
        pMVar9 = this->_root;
        if (pMVar9 == (MemNode *)0x0) {
          this->_root = __ptr;
          pMVar9 = __ptr;
        }
        else {
          uVar7 = 0;
          local_58 = (RbNode *)0x0;
          puStack_48 = (uint8_t *)0x0;
          uStack_40 = 0;
          uStack_3c = 0;
          pMStack_50 = pMVar9;
          pMVar4 = (MemNode *)0x0;
          pMVar8 = (MemNode *)0x0;
          pMVar29 = (MemNode *)&stack0xffffffffffffffa8;
          uVar22 = 0;
          while( true ) {
            pMVar25 = pMVar8;
            pMVar21 = pMVar4;
            uVar10 = (uint)uVar7;
            if (pMVar9 == (MemNode *)0x0) {
              (pMVar25->super_RbNode).node[uVar7] = (RbNode *)__ptr;
              pMVar8 = __ptr;
            }
            else {
              pRVar23 = (pMVar9->super_RbNode).node[0];
              pMVar8 = pMVar9;
              if ((((pRVar23 != (RbNode *)0x0) && (pRVar23->red != 0)) &&
                  (pRVar27 = (pMVar9->super_RbNode).node[1], pRVar27 != (RbNode *)0x0)) &&
                 (pRVar27->red != 0)) {
                (pMVar9->super_RbNode).red = 1;
                pRVar23->red = 0;
                pRVar27->red = 0;
              }
            }
            if (((pMVar25 != (MemNode *)0x0) && ((pMVar8->super_RbNode).red != 0)) &&
               ((pMVar25->super_RbNode).red != 0)) {
              bVar33 = uVar22 == 0;
              pMVar9 = (MemNode *)(pMVar29->super_RbNode).node[1];
              bVar3 = !bVar33;
              pRVar23 = (pMVar21->super_RbNode).node[bVar3];
              pRVar27 = pRVar23->node[bVar33];
              if (pMVar8 == (MemNode *)(pMVar25->super_RbNode).node[uVar22]) {
                ppRVar15 = pRVar23->node + bVar33;
              }
              else {
                uVar7 = (ulong)((uint)bVar3 * 8);
                pRVar23->node[bVar33] = *(RbNode **)((long)pRVar27->node + uVar7);
                *(RbNode **)((long)pRVar27->node + uVar7) = pRVar23;
                pRVar23->red = 1;
                *(RbNode **)((long)(pMVar21->super_RbNode).node + uVar7) = pRVar27;
                ppRVar15 = pRVar27->node + bVar33;
                pRVar23 = pRVar27;
                pRVar27 = pRVar27->node[bVar33];
              }
              (pMVar21->super_RbNode).node[bVar3] = pRVar27;
              *ppRVar15 = &pMVar21->super_RbNode;
              (pMVar21->super_RbNode).red = 1;
              pRVar23->red = 0;
              (pMVar29->super_RbNode).node[pMVar9 == pMVar21] = pRVar23;
            }
            if (pMVar8 == __ptr) break;
            uVar7 = (ulong)((pMVar8->super_RbNode).mem < (__ptr->super_RbNode).mem);
            pMVar9 = (MemNode *)(pMVar8->super_RbNode).node[uVar7];
            pMVar4 = pMVar25;
            uVar22 = uVar10;
            if (pMVar21 != (MemNode *)0x0) {
              pMVar29 = pMVar21;
            }
          }
          this->_root = pMStack_50;
          pMVar9 = pMStack_50;
        }
        (pMVar9->super_RbNode).red = 0;
        pMVar9 = this->_last;
        __ptr->prev = pMVar9;
        if (this->_first == (MemNode *)0x0) {
          this->_first = __ptr;
        }
        else {
          ppMVar12 = &pMVar9->next;
        }
        *ppMVar12 = __ptr;
        this->_last = __ptr;
        iVar5 = rbAssert(&this->_root->super_RbNode);
        if (0 < iVar5) {
          sVar31 = 0;
          len = ((uVar32 - 1) + __ptr->density) / __ptr->density;
          this->_allocatedBytes = this->_allocatedBytes + __ptr->size;
          buf = __ptr->baUsed;
LAB_00173332:
          _SetBits(buf,sVar31,len);
          _SetBits(__ptr->baCont,sVar31,len - 1);
          lVar30 = len * __ptr->density;
          lVar19 = __ptr->density * sVar31;
          __ptr->used = __ptr->used + lVar30;
          __ptr->largestBlock = 0;
          this->_usedBytes = this->_usedBytes + lVar30;
          if ((-1 < lVar19) &&
             (puVar2 = (__ptr->super_RbNode).mem, puVar18 = puVar2 + lVar19,
             puVar18 <= puVar2 + (__ptr->size - uVar32))) goto LAB_00173382;
          alloc();
        }
        alloc();
      }
      OSUtils::releaseVirtualMemory(puVar18,(size_t)pRVar23);
      if (__ptr != (MemNode *)0x0) {
        free(__ptr);
      }
      if (__s != (PermanentNode *)0x0) {
LAB_001732b1:
        free(__s);
      }
    }
LAB_001732b6:
    puVar18 = (uint8_t *)0x0;
  }
LAB_00173382:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return puVar18;
}

Assistant:

void* VMemMgr::alloc(size_t size, uint32_t type) noexcept {
  if (type == kAllocPermanent)
    return vMemMgrAllocPermanent(this, size);
  else
    return vMemMgrAllocFreeable(this, size);
}